

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O1

parser_error parse_mon_base_name(parser *p)

{
  void *pvVar1;
  undefined8 *v;
  char *pcVar2;
  
  pvVar1 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x30);
  *v = pvVar1;
  pcVar2 = parser_getstr(p,"name");
  pcVar2 = string_make(pcVar2);
  v[1] = pcVar2;
  parser_setpriv(p,v);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_mon_base_name(struct parser *p) {
	struct monster_base *h = parser_priv(p);
	struct monster_base *rb = mem_zalloc(sizeof *rb);
	rb->next = h;
	rb->name = string_make(parser_getstr(p, "name"));
	parser_setpriv(p, rb);
	return PARSE_ERROR_NONE;
}